

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

void czh::utils::grisu_round
               (string *buffer,uint64_t delta,uint64_t rest,uint64_t ten_kappa,uint64_t wp_w)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = delta - rest;
  uVar3 = wp_w - rest;
  for (; ((rest < wp_w && (bVar4 = ten_kappa <= uVar2, uVar2 = uVar2 - ten_kappa, bVar4)) &&
         ((rest + ten_kappa < wp_w || (rest + (ten_kappa - wp_w) < uVar3))));
      uVar3 = uVar3 - ten_kappa) {
    pcVar1 = (buffer->_M_dataplus)._M_p + (buffer->_M_string_length - 1);
    *pcVar1 = *pcVar1 + -1;
    rest = rest + ten_kappa;
  }
  return;
}

Assistant:

void grisu_round(std::string &buffer, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t wp_w)
  {
    while (rest < wp_w &&
           delta - rest >= ten_kappa &&
           (rest + ten_kappa < wp_w || /// closer
            wp_w - rest > rest + ten_kappa - wp_w))
    {
      --buffer.back();
      rest += ten_kappa;
    }
  }